

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

uint decode_uid(char *s)

{
  char cVar1;
  ushort **ppuVar2;
  int *piVar3;
  ulong uVar4;
  uint uVar5;
  
  uVar5 = 0xffffffff;
  if ((s != (char *)0x0) && (cVar1 = *s, (long)cVar1 != 0)) {
    ppuVar2 = __ctype_b_loc();
    if ((*(byte *)((long)*ppuVar2 + (long)cVar1 * 2 + 1) & 4) == 0) {
      piVar3 = __errno_location();
      *piVar3 = 0;
      uVar4 = strtoul(s,(char **)0x0,0);
      uVar5 = -(uint)(*piVar3 != 0) | (uint)uVar4;
    }
  }
  return uVar5;
}

Assistant:

unsigned int decode_uid(const char *s)
{
    unsigned int v;

    if (!s || *s == '\0')
        return -1U;
    if (isalpha(s[0]))
        return android_name_to_id(s);

    errno = 0;
    v = (unsigned int) strtoul(s, 0, 0);
    if (errno)
        return -1U;
    return v;
}